

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O0

Vec_Int_t * Gia_ManProcessOutputs(Vec_Ptr_t *vCexesIn,Vec_Ptr_t *vCexesOut,Vec_Int_t *vOutMap)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  void *pvVar3;
  int local_34;
  int iOut;
  int i;
  Vec_Int_t *vLeftOver;
  Abc_Cex_t *pCex;
  Vec_Int_t *vOutMap_local;
  Vec_Ptr_t *vCexesOut_local;
  Vec_Ptr_t *vCexesIn_local;
  
  iVar1 = Vec_PtrSize(vCexesIn);
  iVar2 = Vec_IntSize(vOutMap);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMulti.c"
                  ,0x37,"Vec_Int_t *Gia_ManProcessOutputs(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  iVar1 = Vec_PtrSize(vCexesIn);
  p = Vec_IntAlloc(iVar1);
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vOutMap);
    if (iVar1 <= local_34) {
      iVar1 = Vec_IntSize(p);
      Vec_IntShrink(vOutMap,iVar1);
      return p;
    }
    iVar1 = Vec_IntEntry(vOutMap,local_34);
    pvVar3 = Vec_PtrEntry(vCexesOut,iVar1);
    if (pvVar3 != (void *)0x0) break;
    pvVar3 = Vec_PtrEntry(vCexesIn,local_34);
    if (pvVar3 == (void *)0x0) {
      iVar2 = Vec_IntSize(p);
      Vec_IntWriteEntry(vOutMap,iVar2,iVar1);
      Vec_IntPush(p,local_34);
    }
    else {
      Vec_PtrWriteEntry(vCexesIn,local_34,(void *)0x0);
      Vec_PtrWriteEntry(vCexesOut,iVar1,pvVar3);
    }
    local_34 = local_34 + 1;
  }
  __assert_fail("Vec_PtrEntry(vCexesOut, iOut) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMulti.c"
                ,0x3b,"Vec_Int_t *Gia_ManProcessOutputs(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Divides outputs into solved and unsolved.]

  Description [Return array of unsolved outputs to extract into a new AIG.
  Updates the resulting CEXes (vCexesOut) and current output map (vOutMap).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_ManProcessOutputs( Vec_Ptr_t * vCexesIn, Vec_Ptr_t * vCexesOut, Vec_Int_t * vOutMap )
{
    Abc_Cex_t * pCex; 
    Vec_Int_t * vLeftOver;
    int i, iOut;
    assert( Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap) );
    vLeftOver = Vec_IntAlloc( Vec_PtrSize(vCexesIn) );
    Vec_IntForEachEntry( vOutMap, iOut, i )
    {
        assert( Vec_PtrEntry(vCexesOut, iOut) == NULL );
        pCex = (Abc_Cex_t *)Vec_PtrEntry( vCexesIn, i );
        if ( pCex ) // found a CEX for output iOut
        {
            Vec_PtrWriteEntry( vCexesIn, i, NULL );
            Vec_PtrWriteEntry( vCexesOut, iOut, pCex );
        }
        else // still unsolved
        {
            Vec_IntWriteEntry( vOutMap, Vec_IntSize(vLeftOver), iOut );
            Vec_IntPush( vLeftOver, i );
        }
    }
    Vec_IntShrink( vOutMap, Vec_IntSize(vLeftOver) );
    return vLeftOver;
}